

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O2

add_torrent_params *
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,bdecode_node *rd,error_code *ec,
          int piece_limit)

{
  info_hash_t *this;
  vector<bitfield,_file_index_t> *this_00;
  torrent_flags_t *current_flags;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *this_01;
  byte *pbVar1;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *this_02;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *this_03;
  pointer pvVar2;
  _Head_base<0UL,_unsigned_int_*,_false> _Var3;
  pointer psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  error_code_enum val;
  pointer pbVar8;
  bool bVar9;
  byte bVar10;
  type_t tVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  size_t i_4;
  int64_t iVar16;
  int64_t iVar17;
  mapped_type *this_04;
  char *pcVar18;
  long lVar19;
  ulong uVar20;
  mapped_type *this_05;
  storage_mode_t sVar21;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  size_t j;
  size_t sVar23;
  piece_index_t i_3;
  long lVar24;
  int i;
  int j_2;
  ulong uVar25;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  string_view key_22;
  string_view key_23;
  string_view key_24;
  string_view sVar26;
  string_view sVar27;
  span<const_char> sVar28;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  string_view key_25;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  string_view key_30;
  string_view key_31;
  string_view key_32;
  string_view key_33;
  string_view key_34;
  string_view key_35;
  string_view key_36;
  string_view key_37;
  string_view key_38;
  string_view key_39;
  string_view key_40;
  string_view key_41;
  string_view key_42;
  string_view url;
  piece_index_t piece;
  bdecode_node mapped_files;
  bdecode_node file_priority;
  bdecode_node trees;
  bdecode_node url_list;
  bdecode_node info;
  bdecode_node trackers;
  pointer local_e8;
  pointer pbStack_e0;
  uint local_d8;
  int tier;
  char *ptr;
  sha256_hash local_50;
  char *pcVar22;
  
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  tVar11 = bdecode_node::type(rd);
  if (tVar11 == dict_t) {
    sVar26._M_str = "allocation";
    sVar26._M_len = 10;
    bdecode_node::dict_find_string(&info,rd,sVar26);
    bVar9 = bdecode_node::operator_cast_to_bool(&info);
    if (bVar9) {
      sVar26 = bdecode_node::string_value(&info);
      __y._M_str = "allocate";
      __y._M_len = 8;
      bVar9 = ::std::operator==(sVar26,__y);
      sVar21 = storage_mode_allocate;
      if (!bVar9) {
        sVar26 = bdecode_node::string_value(&info);
        __y_00._M_str = "full";
        __y_00._M_len = 4;
        bVar9 = ::std::operator==(sVar26,__y_00);
        sVar21 = (storage_mode_t)!bVar9;
      }
      __return_storage_ptr__->storage_mode = sVar21;
    }
    ::std::
    _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
    ~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   *)&info);
    sVar27._M_str = "file-format";
    sVar27._M_len = 0xb;
    sVar26 = bdecode_node::dict_find_string_value(rd,sVar27,(string_view)ZEXT816(0));
    __y_01._M_str = "libtorrent resume file";
    __y_01._M_len = 0x16;
    bVar9 = ::std::operator!=(sVar26,__y_01);
    if ((bVar9) ||
       (key._M_str = "file-version", key._M_len = 0xc,
       iVar16 = bdecode_node::dict_find_int_value(rd,key,1), iVar16 - 3U < 0xfffffffffffffffe)) {
      val = invalid_file_tag;
    }
    else {
      key_00._M_str = "info-hash";
      key_00._M_len = 9;
      sVar26 = bdecode_node::dict_find_string_value(rd,key_00,(string_view)ZEXT816(0));
      pcVar18 = sVar26._M_str;
      key_01._M_str = "info-hash2";
      key_01._M_len = 10;
      sVar27 = bdecode_node::dict_find_string_value(rd,key_01,(string_view)ZEXT816(0));
      pcVar22 = sVar27._M_str;
      if (sVar27._M_len == 0x20 || sVar26._M_len == 0x14) {
        key_02._M_str = "name";
        key_02._M_len = 4;
        info.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._0_16_ =
             bdecode_node::dict_find_string_value(rd,key_02,(string_view)ZEXT816(0));
        ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&__return_storage_ptr__->name,
                   (basic_string_view<char,_std::char_traits<char>_> *)&info);
        if (sVar26._M_len == 0x14) {
          (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4] = *(uint *)(pcVar18 + 0x10);
          uVar5 = *(undefined8 *)(pcVar18 + 8);
          *(undefined8 *)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems =
               *(undefined8 *)pcVar18;
          *(undefined8 *)((__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2) = uVar5;
        }
        if (sVar27._M_len == 0x20) {
          uVar5 = *(undefined8 *)pcVar22;
          uVar6 = *(undefined8 *)(pcVar22 + 8);
          uVar7 = *(undefined8 *)(pcVar22 + 0x18);
          *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 4) =
               *(undefined8 *)(pcVar22 + 0x10);
          *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 6) = uVar7;
          *(undefined8 *)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems = uVar5;
          *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2) = uVar6;
        }
        key_25._M_str = "info";
        key_25._M_len = 4;
        bdecode_node::dict_find_dict(&info,rd,key_25);
        bVar9 = bdecode_node::operator_cast_to_bool(&info);
        if (bVar9) {
          sVar28 = bdecode_node::data_section(&info);
          lcrypto::hasher::hasher((hasher *)&mapped_files,sVar28);
          lcrypto::hasher::final((sha1_hash *)&local_e8,(hasher *)&mapped_files);
          sVar28 = bdecode_node::data_section(&info);
          lcrypto::hasher256::hasher256((hasher256 *)&file_priority,sVar28);
          lcrypto::hasher256::final(&local_50,(hasher256 *)&file_priority);
          trees.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_d8;
          trees.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = local_e8;
          trees.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbStack_e0;
          trees._20_8_ = local_50.m_number._M_elems._0_8_;
          trees._28_8_ = local_50.m_number._M_elems._8_8_;
          trees._36_8_ = local_50.m_number._M_elems._16_8_;
          trees.m_token_idx = local_50.m_number._M_elems[6];
          trees.m_last_index = local_50.m_number._M_elems[7];
          lcrypto::hasher256::~hasher256((hasher256 *)&file_priority);
          lcrypto::hasher::~hasher((hasher *)&mapped_files);
          this = &__return_storage_ptr__->info_hashes;
          bVar9 = info_hash_t::has_v1(this);
          if (((bVar9) &&
              (bVar9 = digest32<160L>::operator==((digest32<160L> *)&trees,&this->v1), !bVar9)) ||
             ((bVar9 = info_hash_t::has_v2(this), bVar9 &&
              (bVar9 = digest32<256L>::operator==
                                 ((digest32<256L> *)
                                  ((long)&trees.m_tokens.
                                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                                  &(__return_storage_ptr__->info_hashes).v2), !bVar9)))) {
            boost::system::error_code::operator=(ec,mismatching_info_hash);
          }
          else {
            ::std::make_shared<libtorrent::torrent_info,libtorrent::info_hash_t_const&>
                      ((info_hash_t *)&mapped_files);
            file_priority.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)(file_priority.m_tokens.
                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           ._M_impl.super__Vector_impl_data._5_8_ << 0x28);
            file_priority.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
            bVar9 = torrent_info::parse_info_section
                              ((torrent_info *)
                               mapped_files.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_start,&info,
                               (error_code *)&file_priority,piece_limit);
            pbVar8 = mapped_files.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (bVar9) {
              key_03._M_str = "creation date";
              key_03._M_len = 0xd;
              iVar17 = bdecode_node::dict_find_int_value(rd,key_03,0);
              torrent_info::internal_set_creation_date((torrent_info *)pbVar8,iVar17);
              pbVar8 = mapped_files.m_tokens.
                       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              key_04._M_str = "created by";
              key_04._M_len = 10;
              sVar26 = bdecode_node::dict_find_string_value
                                 (rd,key_04,(string_view)(ZEXT816(0x3829db) << 0x40));
              torrent_info::internal_set_creator((torrent_info *)pbVar8,sVar26);
              key_05._M_str = "comment";
              key_05._M_len = 7;
              sVar26 = bdecode_node::dict_find_string_value
                                 (rd,key_05,(string_view)(ZEXT816(0x3829db) << 0x40));
              torrent_info::internal_set_comment
                        ((torrent_info *)
                         mapped_files.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar26);
            }
            else {
              *(pointer *)ec =
                   file_priority.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              ec->cat_ = (error_category *)
                         file_priority.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(__return_storage_ptr__->ti).
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)
                       &mapped_files);
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &mapped_files.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
          }
        }
        info_hash_t::get_best((sha1_hash *)&trees,&__return_storage_ptr__->info_hashes);
        (__return_storage_ptr__->info_hash).m_number._M_elems[4] =
             (uint)trees.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        *(pointer *)(__return_storage_ptr__->info_hash).m_number._M_elems =
             trees.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((__return_storage_ptr__->info_hash).m_number._M_elems + 2) =
             trees.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        key_26._M_str = "trees";
        key_26._M_len = 5;
        bdecode_node::dict_find_list(&trees,rd,key_26);
        bVar9 = bdecode_node::operator_cast_to_bool(&trees);
        if (bVar9) {
          iVar12 = bdecode_node::list_size(&trees);
          aux::
          container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
          ::reserve<int,void>((container_wrapper<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>>
                               *)&__return_storage_ptr__->merkle_trees,iVar12);
          iVar12 = bdecode_node::list_size(&trees);
          this_00 = &__return_storage_ptr__->verified_leaf_hashes;
          aux::
          container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
          ::reserve<int,void>((container_wrapper<libtorrent::bitfield,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>>
                               *)this_00,iVar12);
          iVar12 = 0;
          while( true ) {
            iVar13 = bdecode_node::list_size(&trees);
            if (iVar13 <= iVar12) break;
            bdecode_node::list_at(&mapped_files,&trees,iVar12);
            tVar11 = bdecode_node::type(&mapped_files);
            if (tVar11 != dict_t) {
LAB_0026dfb7:
              ::std::
              _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               *)&mapped_files);
              break;
            }
            key_27._M_str = "hashes";
            key_27._M_len = 6;
            bdecode_node::dict_find_string(&file_priority,&mapped_files,key_27);
            bVar9 = bdecode_node::operator_cast_to_bool(&file_priority);
            if ((!bVar9) ||
               (uVar14 = bdecode_node::string_length(&file_priority), (uVar14 & 0x1f) != 0)) {
              ::std::
              _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               *)&file_priority);
              goto LAB_0026dfb7;
            }
            ::std::
            vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            ::emplace_back<>(&(__return_storage_ptr__->merkle_trees).
                              super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                            );
            pvVar2 = (__return_storage_ptr__->merkle_trees).
                     super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                     .
                     super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar26 = bdecode_node::string_value(&file_priority);
            ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ::reserve(pvVar2 + -1,sVar26._M_len >> 5);
            trackers.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._0_16_ = bdecode_node::string_value(&file_priority);
            while (trackers.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start != 0) {
              ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                          *)((__return_storage_ptr__->merkle_trees).
                             super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                             .
                             super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1),
                         (basic_string_view<char,_std::char_traits<char>_> *)&trackers);
              trackers.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._0_16_ =
                   ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                             ((basic_string_view<char,_std::char_traits<char>_> *)&trackers,0x20,
                              0xffffffffffffffff);
            }
            key_28._M_str = "verified";
            key_28._M_len = 8;
            bdecode_node::dict_find_string(&trackers,&mapped_files,key_28);
            bVar9 = bdecode_node::operator_cast_to_bool(&trackers);
            if (bVar9) {
              sVar26 = bdecode_node::string_value(&trackers);
              if (iVar16 == 1) {
                url_list.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(url_list.m_tokens.
                                       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)sVar26._M_len);
                ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
                emplace_back<int>(&this_00->
                                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ,(int *)&url_list);
                for (sVar23 = 0; sVar26._M_len != sVar23; sVar23 = sVar23 + 1) {
                  if ((&((pointer)sVar26._M_str)->field_0x0)[sVar23] == '1') {
                    bitfield::set_bit((__return_storage_ptr__->verified_leaf_hashes).
                                      super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                      .
                                      super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1,(int)sVar23);
                  }
                }
              }
              else {
                url._M_len._0_4_ = (int)sVar26._M_len * 8;
                url_list.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar26._M_str;
                ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
                emplace_back<char_const*,int>
                          ((vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                           this_00,(char **)&url_list,(int *)&url);
              }
            }
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&trackers);
            key_29._M_str = "mask";
            key_29._M_len = 4;
            bdecode_node::dict_find_string(&trackers,&mapped_files,key_29);
            bVar9 = bdecode_node::operator_cast_to_bool(&trackers);
            if (bVar9) {
              sVar26 = bdecode_node::string_value(&trackers);
              if (iVar16 == 1) {
                url_list.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(url_list.m_tokens.
                                       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)sVar26._M_len);
                ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
                emplace_back<int>(&(__return_storage_ptr__->merkle_tree_mask).
                                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                  ,(int *)&url_list);
                for (sVar23 = 0; sVar26._M_len != sVar23; sVar23 = sVar23 + 1) {
                  if ((&((pointer)sVar26._M_str)->field_0x0)[sVar23] == '1') {
                    bitfield::set_bit((__return_storage_ptr__->merkle_tree_mask).
                                      super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                      .
                                      super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1,(int)sVar23);
                  }
                }
              }
              else {
                url._M_len._0_4_ = (int)sVar26._M_len * 8;
                url_list.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar26._M_str;
                ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
                emplace_back<char_const*,int>
                          ((vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                           &__return_storage_ptr__->merkle_tree_mask,(char **)&url_list,(int *)&url)
                ;
              }
            }
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&trackers);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&file_priority);
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&mapped_files);
            iVar12 = iVar12 + 1;
          }
        }
        key_06._M_str = "total_uploaded";
        key_06._M_len = 0xe;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_06,0);
        __return_storage_ptr__->total_uploaded = iVar17;
        key_07._M_str = "total_downloaded";
        key_07._M_len = 0x10;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_07,0);
        __return_storage_ptr__->total_downloaded = iVar17;
        key_08._M_str = "active_time";
        key_08._M_len = 0xb;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_08,0);
        __return_storage_ptr__->active_time = (int)iVar17;
        key_09._M_str = "finished_time";
        key_09._M_len = 0xd;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_09,0);
        __return_storage_ptr__->finished_time = (int)iVar17;
        key_10._M_str = "seeding_time";
        key_10._M_len = 0xc;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_10,0);
        __return_storage_ptr__->seeding_time = (int)iVar17;
        key_11._M_str = "last_seen_complete";
        key_11._M_len = 0x12;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_11,0);
        __return_storage_ptr__->last_seen_complete = iVar17;
        key_12._M_str = "last_download";
        key_12._M_len = 0xd;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_12,0);
        __return_storage_ptr__->last_download = iVar17;
        key_13._M_str = "last_upload";
        key_13._M_len = 0xb;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_13,0);
        __return_storage_ptr__->last_upload = iVar17;
        key_14._M_str = "num_complete";
        key_14._M_len = 0xc;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_14,-1);
        __return_storage_ptr__->num_complete = (int)iVar17;
        key_15._M_str = "num_incomplete";
        key_15._M_len = 0xe;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_15,-1);
        __return_storage_ptr__->num_incomplete = (int)iVar17;
        key_16._M_str = "num_downloaded";
        key_16._M_len = 0xe;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_16,-1);
        __return_storage_ptr__->num_downloaded = (int)iVar17;
        key_17._M_str = "max_uploads";
        key_17._M_len = 0xb;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_17,-1);
        __return_storage_ptr__->max_uploads = (int)iVar17;
        key_18._M_str = "max_connections";
        key_18._M_len = 0xf;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_18,-1);
        __return_storage_ptr__->max_connections = (int)iVar17;
        key_19._M_str = "upload_rate_limit";
        key_19._M_len = 0x11;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_19,-1);
        __return_storage_ptr__->upload_limit = (int)iVar17;
        key_20._M_str = "download_rate_limit";
        key_20._M_len = 0x13;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_20,-1);
        __return_storage_ptr__->download_limit = (int)iVar17;
        current_flags = &__return_storage_ptr__->flags;
        anon_unknown_27::apply_flag(current_flags,rd,"seed_mode",(torrent_flags_t)0x1);
        anon_unknown_27::apply_flag(current_flags,rd,"upload_mode",(torrent_flags_t)0x2);
        anon_unknown_27::apply_flag(current_flags,rd,"share_mode",(torrent_flags_t)0x4);
        anon_unknown_27::apply_flag(current_flags,rd,"apply_ip_filter",(torrent_flags_t)0x8);
        anon_unknown_27::apply_flag(current_flags,rd,"paused",(torrent_flags_t)0x10);
        anon_unknown_27::apply_flag(current_flags,rd,"auto_managed",(torrent_flags_t)0x20);
        anon_unknown_27::apply_flag(current_flags,rd,"super_seeding",(torrent_flags_t)0x100);
        anon_unknown_27::apply_flag(current_flags,rd,"i2p",(torrent_flags_t)0x1000000);
        anon_unknown_27::apply_flag(current_flags,rd,"sequential_download",(torrent_flags_t)0x200);
        anon_unknown_27::apply_flag(current_flags,rd,"stop_when_ready",(torrent_flags_t)0x400);
        anon_unknown_27::apply_flag(current_flags,rd,"disable_dht",(torrent_flags_t)0x80000);
        anon_unknown_27::apply_flag(current_flags,rd,"disable_lsd",(torrent_flags_t)0x100000);
        anon_unknown_27::apply_flag(current_flags,rd,"disable_pex",(torrent_flags_t)0x200000);
        key_21._M_str = "save_path";
        key_21._M_len = 9;
        mapped_files.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._0_16_ =
             bdecode_node::dict_find_string_value(rd,key_21,(string_view)ZEXT816(0));
        ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&__return_storage_ptr__->save_path,
                   (basic_string_view<char,_std::char_traits<char>_> *)&mapped_files);
        key_30._M_str = "mapped_files";
        key_30._M_len = 0xc;
        bdecode_node::dict_find_list(&mapped_files,rd,key_30);
        bVar9 = bdecode_node::operator_cast_to_bool(&mapped_files);
        if (bVar9) {
          for (iVar12 = 0; iVar13 = bdecode_node::list_size(&mapped_files), iVar12 < iVar13;
              iVar12 = iVar12 + 1) {
            file_priority.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._0_16_ =
                 bdecode_node::list_string_value_at(&mapped_files,iVar12,(string_view)ZEXT816(0));
            if (file_priority.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
              trackers.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar12;
              this_04 = ::std::
                        map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&(__return_storage_ptr__->renamed_files).
                                      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ,(key_type *)&trackers);
              ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                        ((string *)this_04,
                         (basic_string_view<char,_std::char_traits<char>_> *)&file_priority);
            }
          }
        }
        key_22._M_str = "added_time";
        key_22._M_len = 10;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_22,0);
        __return_storage_ptr__->added_time = iVar17;
        key_23._M_str = "completed_time";
        key_23._M_len = 0xe;
        iVar17 = bdecode_node::dict_find_int_value(rd,key_23,0);
        __return_storage_ptr__->completed_time = iVar17;
        key_31._M_str = "file_priority";
        key_31._M_len = 0xd;
        bdecode_node::dict_find_list(&file_priority,rd,key_31);
        bVar9 = bdecode_node::operator_cast_to_bool(&file_priority);
        if (bVar9) {
          uVar14 = bdecode_node::list_size(&file_priority);
          this_01 = &__return_storage_ptr__->file_priorities;
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::resize(this_01,(long)(int)uVar14,(value_type *)&default_priority);
          uVar25 = 0;
          uVar20 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar20 = uVar25;
          }
          for (; uVar20 != uVar25; uVar25 = uVar25 + 1) {
            iVar17 = bdecode_node::list_int_value_at(&file_priority,(int)uVar25,4);
            bVar10 = (byte)iVar17;
            if (6 < bVar10) {
              bVar10 = 7;
            }
            (this_01->
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar25].m_val = bVar10;
            if ((this_01->
                super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar25].m_val == '\0') {
              *(byte *)&current_flags->m_val = (byte)current_flags->m_val & 0xfe;
            }
          }
        }
        key_32._M_str = "trackers";
        key_32._M_len = 8;
        bdecode_node::dict_find_list(&trackers,rd,key_32);
        bVar9 = bdecode_node::operator_cast_to_bool(&trackers);
        if (bVar9) {
          pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
          *pbVar1 = *pbVar1 | 8;
          tier = 0;
          for (iVar12 = 0; iVar13 = bdecode_node::list_size(&trackers), iVar12 < iVar13;
              iVar12 = iVar12 + 1) {
            bdecode_node::list_at(&url_list,&trackers,iVar12);
            bVar9 = bdecode_node::operator_cast_to_bool(&url_list);
            if ((bVar9) && (tVar11 = bdecode_node::type(&url_list), tVar11 == list_t)) {
              for (iVar13 = 0; iVar15 = bdecode_node::list_size(&url_list), iVar13 < iVar15;
                  iVar13 = iVar13 + 1) {
                url = bdecode_node::list_string_value_at(&url_list,iVar13,(string_view)ZEXT816(0));
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &__return_storage_ptr__->trackers,&url);
                ::std::vector<int,_std::allocator<int>_>::push_back
                          (&__return_storage_ptr__->tracker_tiers,&tier);
                bVar9 = aux::is_i2p_url((string *)
                                        ((__return_storage_ptr__->trackers).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + -1));
                if (bVar9) {
                  pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 3);
                  *pbVar1 = *pbVar1 | 1;
                }
              }
              tier = tier + 1;
            }
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&url_list);
          }
        }
        key_33._M_str = "url-list";
        key_33._M_len = 8;
        bdecode_node::dict_find_list(&url_list,rd,key_33);
        bVar9 = bdecode_node::operator_cast_to_bool(&url_list);
        if (bVar9) {
          pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
          *pbVar1 = *pbVar1 | 0x10;
          for (iVar12 = 0; iVar13 = bdecode_node::list_size(&url_list), iVar12 < iVar13;
              iVar12 = iVar12 + 1) {
            url = bdecode_node::list_string_value_at(&url_list,iVar12,(string_view)ZEXT816(0));
            if (url._M_len != 0) {
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &__return_storage_ptr__->url_seeds,&url);
            }
          }
        }
        key_34._M_str = "pieces";
        key_34._M_len = 6;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_34);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          if (iVar16 == 2) {
            sVar26 = bdecode_node::string_value((bdecode_node *)&url);
            bitfield::assign(&(__return_storage_ptr__->have_pieces).super_bitfield,sVar26._M_str,
                             (int)sVar26._M_len << 3);
          }
          else if (iVar16 == 1) {
            pcVar18 = bdecode_node::string_ptr((bdecode_node *)&url);
            iVar12 = bdecode_node::string_length((bdecode_node *)&url);
            this_02 = &__return_storage_ptr__->have_pieces;
            bitfield::resize(&this_02->super_bitfield,iVar12);
            this_03 = &__return_storage_ptr__->verified_pieces;
            bitfield::resize(&this_03->super_bitfield,iVar12);
            lVar24 = 0;
            bVar9 = false;
            while( true ) {
              _Var3._M_head_impl =
                   *(uint **)&(this_03->super_bitfield).m_buf.
                              super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
              ;
              if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var3._M_head_impl ==
                  (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
                lVar19 = 0;
              }
              else {
                lVar19 = (long)(int)*_Var3._M_head_impl;
              }
              if (lVar19 <= lVar24) break;
              iVar12 = (int)lVar24;
              if ((pcVar18[lVar24] & 1U) == 0) {
                bitfield::clear_bit(&this_02->super_bitfield,iVar12);
              }
              else {
                bitfield::set_bit(&this_02->super_bitfield,iVar12);
              }
              if ((pcVar18[lVar24] & 2U) == 0) {
                bitfield::clear_bit(&this_03->super_bitfield,iVar12);
              }
              else {
                bitfield::set_bit(&this_03->super_bitfield,iVar12);
                bVar9 = true;
              }
              lVar24 = lVar24 + 1;
            }
            if (!bVar9) {
              bitfield::clear(&this_03->super_bitfield);
            }
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_35._M_str = "verified";
        key_35._M_len = 8;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_35);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          sVar26 = bdecode_node::string_value((bdecode_node *)&url);
          bitfield::assign(&(__return_storage_ptr__->verified_pieces).super_bitfield,sVar26._M_str,
                           (int)sVar26._M_len << 3);
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_36._M_str = "piece_priority";
        key_36._M_len = 0xe;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_36);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          pcVar18 = bdecode_node::string_ptr((bdecode_node *)&url);
          iVar12 = bdecode_node::string_length((bdecode_node *)&url);
          ::std::
          vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ::resize(&__return_storage_ptr__->piece_priorities,(long)iVar12);
          for (uVar20 = 0;
              psVar4 = (__return_storage_ptr__->piece_priorities).
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
              uVar20 < (ulong)((long)(__return_storage_ptr__->piece_priorities).
                                     super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar4);
              uVar20 = uVar20 + 1) {
            bVar10 = pcVar18[uVar20];
            if (6 < bVar10) {
              bVar10 = 7;
            }
            psVar4[uVar20].m_val = bVar10;
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_37._M_str = "peers";
        key_37._M_len = 5;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_37);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          ptr = bdecode_node::string_ptr((bdecode_node *)&url);
          for (iVar12 = 5; iVar13 = bdecode_node::string_length((bdecode_node *)&url),
              iVar12 < iVar13; iVar12 = iVar12 + 6) {
            aux::
            read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&tier,(aux *)&ptr,in);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&__return_storage_ptr__->peers,
                       (basic_endpoint<boost::asio::ip::tcp> *)&tier);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_38._M_str = "peers6";
        key_38._M_len = 6;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_38);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          ptr = bdecode_node::string_ptr((bdecode_node *)&url);
          for (iVar12 = 0x11; iVar13 = bdecode_node::string_length((bdecode_node *)&url),
              iVar12 < iVar13; iVar12 = iVar12 + 0x12) {
            aux::
            read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&tier,(aux *)&ptr,in_00);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&__return_storage_ptr__->peers,
                       (basic_endpoint<boost::asio::ip::tcp> *)&tier);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_39._M_str = "banned_peers";
        key_39._M_len = 0xc;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_39);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          ptr = bdecode_node::string_ptr((bdecode_node *)&url);
          for (iVar12 = 6; iVar13 = bdecode_node::string_length((bdecode_node *)&url),
              iVar12 < iVar13; iVar12 = iVar12 + 6) {
            aux::
            read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&tier,(aux *)&ptr,in_01);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&__return_storage_ptr__->banned_peers,
                       (basic_endpoint<boost::asio::ip::tcp> *)&tier);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_40._M_str = "banned_peers6";
        key_40._M_len = 0xd;
        bdecode_node::dict_find_string((bdecode_node *)&url,rd,key_40);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          ptr = bdecode_node::string_ptr((bdecode_node *)&url);
          for (iVar12 = 0x11; iVar13 = bdecode_node::string_length((bdecode_node *)&url),
              iVar12 < iVar13; iVar12 = iVar12 + 0x12) {
            aux::
            read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)&tier,(aux *)&ptr,in_02);
            ::std::
            vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
            ::emplace_back<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                      ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                        *)&__return_storage_ptr__->banned_peers,
                       (basic_endpoint<boost::asio::ip::tcp> *)&tier);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        key_41._M_str = "unfinished";
        key_41._M_len = 10;
        bdecode_node::dict_find_list((bdecode_node *)&url,rd,key_41);
        bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&url);
        if (bVar9) {
          for (iVar12 = 0; iVar13 = bdecode_node::list_size((bdecode_node *)&url), iVar12 < iVar13;
              iVar12 = iVar12 + 1) {
            bdecode_node::list_at((bdecode_node *)&tier,(bdecode_node *)&url,iVar12);
            tVar11 = bdecode_node::type((bdecode_node *)&tier);
            if (tVar11 == dict_t) {
              key_24._M_str = "piece";
              key_24._M_len = 5;
              iVar16 = bdecode_node::dict_find_int_value((bdecode_node *)&tier,key_24,-1);
              piece.m_val = (int)iVar16;
              if (-1 < piece.m_val) {
                key_42._M_str = "bitmask";
                key_42._M_len = 7;
                bdecode_node::dict_find_string((bdecode_node *)&ptr,(bdecode_node *)&tier,key_42);
                bVar9 = bdecode_node::operator_cast_to_bool((bdecode_node *)&ptr);
                if ((bVar9) &&
                   (iVar13 = bdecode_node::string_length((bdecode_node *)&ptr), iVar13 != 0)) {
                  this_05 = ::std::
                            map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                            ::operator[](&(__return_storage_ptr__->unfinished_pieces).
                                          super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                                         ,&piece);
                  pcVar18 = bdecode_node::string_ptr((bdecode_node *)&ptr);
                  iVar13 = bdecode_node::string_length((bdecode_node *)&ptr);
                  bitfield::assign(this_05,pcVar18,iVar13 << 3);
                }
                ::std::
                _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 *)&ptr);
              }
            }
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&tier);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url);
        pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
        *pbVar1 = *pbVar1 & 0xdf;
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&url_list);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&trackers);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&file_priority);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&mapped_files);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&trees);
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&info);
        return __return_storage_ptr__;
      }
      val = missing_info_hash;
    }
    boost::system::error_code::operator=(ec,val);
  }
  else {
    boost::system::error_code::operator=(ec,not_a_dictionary);
  }
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(bdecode_node const& rd, error_code& ec
		, int const piece_limit)
	{
		add_torrent_params ret;
		if (rd.type() != bdecode_node::dict_t)
		{
			ec = errors::not_a_dictionary;
			return ret;
		}

		if (bdecode_node const alloc = rd.dict_find_string("allocation"))
		{
			ret.storage_mode = (alloc.string_value() == "allocate"
				|| alloc.string_value() == "full")
				? storage_mode_allocate : storage_mode_sparse;
		}

		if (rd.dict_find_string_value("file-format")
			!= "libtorrent resume file")
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		std::int64_t const file_version = rd.dict_find_int_value("file-version", 1);

		if (file_version != 1 && file_version != 2)
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		auto info_hash = rd.dict_find_string_value("info-hash");
		auto info_hash2 = rd.dict_find_string_value("info-hash2");
		if (info_hash.size() != std::size_t(sha1_hash::size())
			&& info_hash2.size() != std::size_t(sha256_hash::size()))
		{
			ec = errors::missing_info_hash;
			return ret;
		}

		ret.name = rd.dict_find_string_value("name");

		if (info_hash.size() == 20)
			ret.info_hashes.v1.assign(info_hash.data());
		if (info_hash2.size() == 32)
			ret.info_hashes.v2.assign(info_hash2.data());

		bdecode_node const info = rd.dict_find_dict("info");
		if (info)
		{
			// verify the info-hash of the metadata stored in the resume file matches
			// the torrent we're loading
			info_hash_t const resume_ih(hasher(info.data_section()).final()
				, hasher256(info.data_section()).final());

			// if url is set, the info_hash is not actually the info-hash of the
			// torrent, but the hash of the URL, until we have the full torrent
			// only require the info-hash to match if we actually passed in one
			if ((!ret.info_hashes.has_v1() || resume_ih.v1 == ret.info_hashes.v1)
				&& (!ret.info_hashes.has_v2() || resume_ih.v2 == ret.info_hashes.v2))
			{
				auto ti = std::make_shared<torrent_info>(resume_ih);

				error_code err;
				if (!ti->parse_info_section(info, err, piece_limit))
				{
					ec = err;
				}
				else
				{
					// time_t might be 32 bit if we're unlucky, but there isn't
					// much to do about it
					ti->internal_set_creation_date(static_cast<std::time_t>(
						rd.dict_find_int_value("creation date", 0)));
					ti->internal_set_creator(rd.dict_find_string_value("created by", ""));
					ti->internal_set_comment(rd.dict_find_string_value("comment", ""));
				}
				ret.ti = std::move(ti);
			}
			else
			{
				ec = errors::mismatching_info_hash;
			}
		}

#if TORRENT_ABI_VERSION < 3
		ret.info_hash = ret.info_hashes.get_best();
#endif

		bdecode_node const trees = rd.dict_find_list("trees");
		if (trees)
		{
			ret.merkle_trees.reserve(trees.list_size());
			ret.verified_leaf_hashes.reserve(trees.list_size());
			for (int i = 0; i < trees.list_size(); ++i)
			{
				auto de = trees.list_at(i);
				if (de.type() != bdecode_node::dict_t)
					break;
				auto dh = de.dict_find_string("hashes");
				if (!dh || dh.string_length() % 32 != 0) break;

				ret.merkle_trees.emplace_back();
				ret.merkle_trees.back().reserve(dh.string_value().size() / 32);
				for (auto hashes = dh.string_value();
					!hashes.empty(); hashes = hashes.substr(32))
				{
					ret.merkle_trees.back().emplace_back(hashes);
				}

				if (bdecode_node const verified = de.dict_find_string("verified"))
				{
					string_view const str = verified.string_value();
					if (file_version == 1)
					{
						ret.verified_leaf_hashes.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.verified_leaf_hashes.back().set_bit(int(j));
						}
					}
					else
					{
						ret.verified_leaf_hashes.emplace_back(str.data(), int(str.size()) * 8);
					}
				}

				if (bdecode_node const mask = de.dict_find_string("mask"))
				{
					string_view const str = mask.string_value();
					if (file_version == 1)
					{
						ret.merkle_tree_mask.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.merkle_tree_mask.back().set_bit(int(j));
						}
					}
					else
					{
						ret.merkle_tree_mask.emplace_back(str.data(), int(str.size()) * 8);
					}
				}
			}
		}

		ret.total_uploaded = rd.dict_find_int_value("total_uploaded");
		ret.total_downloaded = rd.dict_find_int_value("total_downloaded");

		ret.active_time = int(rd.dict_find_int_value("active_time"));
		ret.finished_time = int(rd.dict_find_int_value("finished_time"));
		ret.seeding_time = int(rd.dict_find_int_value("seeding_time"));

		ret.last_seen_complete = std::time_t(rd.dict_find_int_value("last_seen_complete"));

		ret.last_download = std::time_t(rd.dict_find_int_value("last_download", 0));
		ret.last_upload = std::time_t(rd.dict_find_int_value("last_upload", 0));

		// scrape data cache
		ret.num_complete = int(rd.dict_find_int_value("num_complete", -1));
		ret.num_incomplete = int(rd.dict_find_int_value("num_incomplete", -1));
		ret.num_downloaded = int(rd.dict_find_int_value("num_downloaded", -1));

		// torrent settings
		ret.max_uploads = int(rd.dict_find_int_value("max_uploads", -1));
		ret.max_connections = int(rd.dict_find_int_value("max_connections", -1));
		ret.upload_limit = int(rd.dict_find_int_value("upload_rate_limit", -1));
		ret.download_limit = int(rd.dict_find_int_value("download_rate_limit", -1));

		// torrent flags
		apply_flag(ret.flags, rd, "seed_mode", torrent_flags::seed_mode);
		apply_flag(ret.flags, rd, "upload_mode", torrent_flags::upload_mode);
#ifndef TORRENT_DISABLE_SHARE_MODE
		apply_flag(ret.flags, rd, "share_mode", torrent_flags::share_mode);
#endif
		apply_flag(ret.flags, rd, "apply_ip_filter", torrent_flags::apply_ip_filter);
		apply_flag(ret.flags, rd, "paused", torrent_flags::paused);
		apply_flag(ret.flags, rd, "auto_managed", torrent_flags::auto_managed);
#ifndef TORRENT_DISABLE_SUPERSEEDING
		apply_flag(ret.flags, rd, "super_seeding", torrent_flags::super_seeding);
#endif
#if TORRENT_USE_I2P
		apply_flag(ret.flags, rd, "i2p", torrent_flags::i2p_torrent);
#endif
		apply_flag(ret.flags, rd, "sequential_download", torrent_flags::sequential_download);
		apply_flag(ret.flags, rd, "stop_when_ready", torrent_flags::stop_when_ready);
		apply_flag(ret.flags, rd, "disable_dht", torrent_flags::disable_dht);
		apply_flag(ret.flags, rd, "disable_lsd", torrent_flags::disable_lsd);
		apply_flag(ret.flags, rd, "disable_pex", torrent_flags::disable_pex);

		ret.save_path = rd.dict_find_string_value("save_path");

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		ret.url = rd.dict_find_string_value("url");
#endif

		bdecode_node const mapped_files = rd.dict_find_list("mapped_files");
		if (mapped_files)
		{
			for (int i = 0; i < mapped_files.list_size(); ++i)
			{
				auto new_filename = mapped_files.list_string_value_at(i);
				if (new_filename.empty()) continue;
				ret.renamed_files[file_index_t(i)] = new_filename;
			}
		}

		ret.added_time = std::time_t(rd.dict_find_int_value("added_time", 0));
		ret.completed_time = std::time_t(rd.dict_find_int_value("completed_time", 0));

		// load file priorities except if the add_torrent_param file was set to
		// override resume data
		bdecode_node const file_priority = rd.dict_find_list("file_priority");
		if (file_priority)
		{
			int const num_files = file_priority.list_size();
			ret.file_priorities.resize(aux::numeric_cast<std::size_t>(num_files)
				, default_priority);
			for (int i = 0; i < num_files; ++i)
			{
				auto const idx = static_cast<std::size_t>(i);
				ret.file_priorities[idx] = std::clamp(
					download_priority_t(static_cast<std::uint8_t>(
						file_priority.list_int_value_at(i
							, static_cast<std::uint8_t>(default_priority))))
						, dont_download, top_priority);
				// this is suspicious, leave seed mode
				if (ret.file_priorities[idx] == dont_download)
				{
					ret.flags &= ~torrent_flags::seed_mode;
				}
			}
		}

		bdecode_node const trackers = rd.dict_find_list("trackers");
		if (trackers)
		{
			// it's possible to delete the trackers from a torrent and then save
			// resume data with an empty trackers list. Since we found a trackers
			// list here, these should replace whatever we find in the .torrent
			// file.
			ret.flags |= torrent_flags::deprecated_override_trackers;

			int tier = 0;
			for (int i = 0; i < trackers.list_size(); ++i)
			{
				bdecode_node const tier_list = trackers.list_at(i);
				if (!tier_list || tier_list.type() != bdecode_node::list_t)
					continue;

				for (int j = 0; j < tier_list.list_size(); ++j)
				{
					ret.trackers.emplace_back(tier_list.list_string_value_at(j));
					ret.tracker_tiers.push_back(tier);
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(ret.trackers.back())) ret.flags |= torrent_flags::i2p_torrent;
#endif
				}
				++tier;
			}
		}

		// if merge resume http seeds is not set, we need to clear whatever web
		// seeds we loaded from the .torrent file, because we want whatever's in
		// the resume file to take precedence. If there aren't even any fields in
		// the resume data though, keep the ones from the torrent
		bdecode_node const url_list = rd.dict_find_list("url-list");
		if (url_list)
		{
			// since we found http seeds in the resume data, they should replace
			// whatever web seeds are specified in the .torrent, by default
			ret.flags |= torrent_flags::deprecated_override_web_seeds;
			for (int i = 0; i < url_list.list_size(); ++i)
			{
				auto url = url_list.list_string_value_at(i);
				if (url.empty()) continue;
				ret.url_seeds.emplace_back(url);
			}
		}

		// some sanity checking. Maybe we shouldn't be in seed mode anymore
		if (bdecode_node const pieces = rd.dict_find_string("pieces"))
		{
			if (file_version == 1)
			{
				char const* pieces_str = pieces.string_ptr();
				int const pieces_len = pieces.string_length();
				ret.have_pieces.resize(pieces_len);
				ret.verified_pieces.resize(pieces_len);
				bool any_verified = false;
				for (piece_index_t i(0); i < ret.verified_pieces.end_index(); ++i)
				{
					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (pieces_str[static_cast<int>(i)] & 1) ret.have_pieces.set_bit(i);
					else ret.have_pieces.clear_bit(i);

					if (pieces_str[static_cast<int>(i)] & 2)
					{
						ret.verified_pieces.set_bit(i);
						any_verified = true;
					}
					else
					{
						ret.verified_pieces.clear_bit(i);
					}
				}
				if (!any_verified) ret.verified_pieces.clear();
			}
			else if (file_version == 2)
			{
				string_view const str = pieces.string_value();
				ret.have_pieces.assign(str.data(), int(str.size()) * 8);
			}
		}

		if (bdecode_node const verified = rd.dict_find_string("verified"))
		{
			string_view const str = verified.string_value();
			ret.verified_pieces.assign(str.data(), int(str.size()) * 8);
		}

		if (bdecode_node const piece_priority = rd.dict_find_string("piece_priority"))
		{
			char const* prio_str = piece_priority.string_ptr();
			ret.piece_priorities.resize(aux::numeric_cast<std::size_t>(piece_priority.string_length()));
			for (std::size_t i = 0; i < ret.piece_priorities.size(); ++i)
			{
				ret.piece_priorities[i] = download_priority_t(std::clamp(
					static_cast<std::uint8_t>(prio_str[i])
					, static_cast<std::uint8_t>(dont_download)
					, static_cast<std::uint8_t>(top_priority)));
			}
		}

		int const v6_size = 18;
		int const v4_size = 6;
		using namespace libtorrent::aux; // for read_*_endpoint()
		if (bdecode_node const peers_entry = rd.dict_find_string("peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size - 1; i < peers_entry.string_length(); i += v4_size)
				ret.peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size; i < peers_entry.string_length(); i += v4_size)
				ret.banned_peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.banned_peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		// parse unfinished pieces
		if (bdecode_node const unfinished_entry = rd.dict_find_list("unfinished"))
		{
			for (int i = 0; i < unfinished_entry.list_size(); ++i)
			{
				bdecode_node const e = unfinished_entry.list_at(i);
				if (e.type() != bdecode_node::dict_t) continue;
				piece_index_t const piece = piece_index_t(int(e.dict_find_int_value("piece", -1)));
				if (piece < piece_index_t(0)) continue;

				bdecode_node const bitmask = e.dict_find_string("bitmask");
				if (!bitmask || bitmask.string_length() == 0) continue;
				ret.unfinished_pieces[piece].assign(
					bitmask.string_ptr(), bitmask.string_length() * CHAR_BIT);
			}
		}

		// we're loading this torrent from resume data. There's no need to
		// re-save the resume data immediately.
		ret.flags &= ~torrent_flags::need_save_resume;

		return ret;
	}